

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  rawSeq *prVar2;
  uint minMatch;
  uint uVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  uint uVar6;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar7;
  long lVar8;
  BYTE *pBVar9;
  ZSTD_dictMode_e dictMode;
  BYTE *pBVar10;
  seqDef *psVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  U32 UVar14;
  
  if ((ms->window).lowLimit < (ms->window).dictLimit) {
    dictMode = ZSTD_extDict;
  }
  else if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
    dictMode = ZSTD_noDict;
  }
  else {
    dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar7;
  }
  pBVar17 = (BYTE *)(srcSize + (long)src);
  pBVar1 = pBVar17 + -0x20;
  while( true ) {
    uVar15 = rawSeqStore->pos;
    uVar20 = (long)pBVar17 - (long)src;
    if ((rawSeqStore->size <= uVar15) || (pBVar17 <= src)) break;
    prVar2 = rawSeqStore->seq + uVar15;
    uVar16._0_4_ = prVar2->offset;
    uVar16._4_4_ = prVar2->litLength;
    uVar18 = uVar16 >> 0x20;
    uVar3 = rawSeqStore->seq[uVar15].matchLength;
    uVar19 = (uint)uVar20;
    if (uVar19 < uVar3 + uVar16._4_4_) {
      uVar15 = uVar16;
      if (uVar19 - uVar16._4_4_ < minMatch) {
        uVar15 = 0;
      }
      uVar6 = uVar19 - uVar16._4_4_;
      if (uVar19 < (uint)uVar16._4_4_ || uVar19 - uVar16._4_4_ == 0) {
        uVar15 = 0;
        uVar6 = uVar3;
      }
      uVar3 = uVar6;
      ZSTD_ldm_skipSequences(rawSeqStore,uVar20 & 0xffffffff,minMatch);
      uVar16 = uVar15;
    }
    else {
      rawSeqStore->pos = uVar15 + 1;
    }
    UVar14 = (U32)uVar16;
    if (UVar14 == 0) break;
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar18);
    for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -4) {
      *(undefined4 *)((long)rep + lVar8) = *(undefined4 *)((long)rep + lVar8 + -4);
    }
    pBVar9 = (BYTE *)((long)src + uVar18);
    *rep = UVar14;
    pBVar12 = pBVar9 + -sVar7;
    pBVar4 = seqStore->lit;
    if (pBVar1 < pBVar9) {
      pBVar10 = pBVar4;
      pBVar13 = pBVar12;
      if (pBVar12 <= pBVar1) {
        pBVar10 = pBVar4 + ((long)pBVar1 - (long)pBVar12);
        uVar5 = *(undefined8 *)(pBVar12 + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)pBVar12;
        *(undefined8 *)(pBVar4 + 8) = uVar5;
        pBVar13 = pBVar1;
        if (0x10 < (long)pBVar1 - (long)pBVar12) {
          lVar8 = 0x10;
          do {
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar8 + (uVar18 - sVar7)) + 8);
            pBVar12 = pBVar4 + lVar8;
            *(undefined8 *)pBVar12 = *(undefined8 *)((long)src + lVar8 + (uVar18 - sVar7));
            *(undefined8 *)(pBVar12 + 8) = uVar5;
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar8 + (uVar18 - sVar7) + 0x10) + 8);
            *(undefined8 *)(pBVar12 + 0x10) =
                 *(undefined8 *)((long)src + lVar8 + (uVar18 - sVar7) + 0x10);
            *(undefined8 *)(pBVar12 + 0x18) = uVar5;
            lVar8 = lVar8 + 0x20;
          } while (pBVar12 + 0x20 < pBVar10);
        }
      }
      for (; pBVar13 < pBVar9; pBVar13 = pBVar13 + 1) {
        *pBVar10 = *pBVar13;
        pBVar10 = pBVar10 + 1;
      }
LAB_005b4138:
      seqStore->lit = seqStore->lit + sVar7;
      psVar11 = seqStore->sequences;
      if (0xffff < sVar7) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)(pBVar12 + 8);
      *(undefined8 *)pBVar4 = *(undefined8 *)pBVar12;
      *(undefined8 *)(pBVar4 + 8) = uVar5;
      pBVar4 = seqStore->lit;
      if (0x10 < sVar7) {
        uVar5 = *(undefined8 *)(pBVar12 + 0x18);
        *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)(pBVar12 + 0x10);
        *(undefined8 *)(pBVar4 + 0x18) = uVar5;
        if (0x20 < (long)sVar7) {
          lVar8 = 0;
          do {
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar8 + (uVar18 - sVar7) + 0x20) + 8);
            pBVar12 = pBVar4 + lVar8 + 0x20;
            *(undefined8 *)pBVar12 = *(undefined8 *)((long)src + lVar8 + (uVar18 - sVar7) + 0x20);
            *(undefined8 *)(pBVar12 + 8) = uVar5;
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar8 + (uVar18 - sVar7) + 0x30) + 8);
            *(undefined8 *)(pBVar12 + 0x10) =
                 *(undefined8 *)((long)src + lVar8 + (uVar18 - sVar7) + 0x30);
            *(undefined8 *)(pBVar12 + 0x18) = uVar5;
            lVar8 = lVar8 + 0x20;
          } while (pBVar12 + 0x20 < pBVar4 + sVar7);
        }
        goto LAB_005b4138;
      }
      seqStore->lit = pBVar4 + sVar7;
      psVar11 = seqStore->sequences;
    }
    psVar11->litLength = (U16)sVar7;
    psVar11->offset = UVar14 + 3;
    if (0xffff < uVar3 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar11->matchLength = (U16)(uVar3 - 3);
    seqStore->sequences = psVar11 + 1;
    src = pBVar9 + uVar3;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar20);
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}